

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

float Gia_ManPatGetTotalQuo(Gia_Man_t *p,int RareLimit,Vec_Wrd_t *vPatterns,int nWords)

{
  Vec_Wrd_t *pVVar1;
  Vec_Int_t *vRareCounts;
  Vec_Wrd_t *vSims;
  int n;
  int iVar2;
  float fVar3;
  float fVar4;
  
  vRareCounts = Gia_SimCollectRare(p,vPatterns,RareLimit);
  pVVar1 = p->vSimsPi;
  p->vSimsPi = vPatterns;
  vSims = Gia_ManSimPatSim(p);
  p->vSimsPi = pVVar1;
  if (nWords < 1) {
    fVar3 = 0.0;
  }
  else {
    iVar2 = 1;
    if (1 < nWords * 0x40) {
      iVar2 = nWords * 0x40;
    }
    n = 0;
    fVar3 = 0.0;
    do {
      fVar4 = Gia_ManPatGetQuo(p,vRareCounts,vSims,n,nWords);
      fVar3 = fVar3 + fVar4;
      n = n + 1;
    } while (iVar2 != n);
  }
  if (vRareCounts->pArray != (int *)0x0) {
    free(vRareCounts->pArray);
    vRareCounts->pArray = (int *)0x0;
  }
  if (vRareCounts != (Vec_Int_t *)0x0) {
    free(vRareCounts);
  }
  if (vSims->pArray != (word *)0x0) {
    free(vSims->pArray);
    vSims->pArray = (word *)0x0;
  }
  if (vSims != (Vec_Wrd_t *)0x0) {
    free(vSims);
  }
  return fVar3;
}

Assistant:

float Gia_ManPatGetTotalQuo( Gia_Man_t * p, int RareLimit, Vec_Wrd_t * vPatterns, int nWords )
{
    float Total = 0; int n;
    Vec_Int_t * vRareCounts = Gia_SimCollectRare( p, vPatterns, RareLimit );
    Vec_Wrd_t * vSims, * vTemp = p->vSimsPi;
    p->vSimsPi = vPatterns;
    vSims = Gia_ManSimPatSim( p );
    p->vSimsPi = vTemp;
    for ( n = 0; n < 64*nWords; n++ )
        Total += Gia_ManPatGetQuo( p, vRareCounts, vSims, n, nWords );
    Vec_IntFree( vRareCounts );
    Vec_WrdFree( vSims );
    return Total;
}